

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

optional<long> __thiscall wallet::CWallet::GetOldestKeyPoolTime(CWallet *this)

{
  _Storage<long,_true> *p_Var1;
  _Base_ptr p_Var2;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  optional<long> oVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock56;
  optional<long> oldest_key;
  _Storage<long,_true> local_58;
  undefined1 local_50;
  unique_lock<std::recursive_mutex> local_48;
  _Storage<long,_true> local_38;
  long lStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_48,&this->cs_wallet,
             "cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0xa18,false);
  if ((this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    lStack_30 = (ulong)lStack_30._1_7_ << 8;
  }
  else {
    local_38._M_value = 0x7fffffffffffffff;
    lStack_30 = CONCAT71(lStack_30._1_7_,1);
    for (p_Var2 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      local_58._M_value = (**(code **)(**(long **)(p_Var2 + 2) + 0x88))();
      local_50 = extraout_DL;
      p_Var1 = (_Storage<long,_true> *)
               std::min<std::optional<long>>
                         ((optional<long> *)&local_38,(optional<long> *)&local_58);
      local_38 = (_Storage<long,_true>)p_Var1->_M_value;
      lStack_30 = p_Var1[1]._M_value;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       (undefined7)((ulong)extraout_RDX >> 8);
  oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = (bool)(undefined1)lStack_30;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = local_38._M_value;
    return (optional<long>)
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> CWallet::GetOldestKeyPoolTime() const
{
    LOCK(cs_wallet);
    if (m_spk_managers.empty()) {
        return std::nullopt;
    }

    std::optional<int64_t> oldest_key{std::numeric_limits<int64_t>::max()};
    for (const auto& spk_man_pair : m_spk_managers) {
        oldest_key = std::min(oldest_key, spk_man_pair.second->GetOldestKeyPoolTime());
    }
    return oldest_key;
}